

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checks.h
# Opt level: O2

string * rtc::MakeCheckOpString<unsigned_int,unsigned_int>(uint *v1,uint *v2,char *names)

{
  ostream *poVar1;
  string *psVar2;
  ostringstream ss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  poVar1 = std::operator<<((ostream *)&ss,names);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," vs. ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,")");
  psVar2 = (string *)operator_new(0x20);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  return psVar2;
}

Assistant:

std::string* MakeCheckOpString(const t1& v1, const t2& v2, const char* names) {
  std::ostringstream ss;
  ss << names << " (" << v1 << " vs. " << v2 << ")";
  std::string* msg = new std::string(ss.str());
  return msg;
}